

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

int Vector4Equals(Vector4 p,Vector4 q)

{
  uint uVar1;
  float fVar2;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_14;
  
  fVar2 = fmaxf(ABS(p.x),ABS(q.x));
  if (fVar2 <= 1.0) {
    fVar2 = 1.0;
  }
  uVar1 = 0;
  if (ABS(p.x - q.x) <= fVar2 * 1e-06) {
    uStack_14 = q.y;
    fVar2 = fmaxf(ABS(p.y),ABS(uStack_14));
    if (fVar2 <= 1.0) {
      fVar2 = 1.0;
    }
    if (ABS(p.y - uStack_14) <= fVar2 * 1e-06) {
      local_48 = p.z;
      uStack_44 = p.w;
      local_38 = q.z;
      fVar2 = fmaxf(ABS(local_48),ABS(local_38));
      if (fVar2 <= 1.0) {
        fVar2 = 1.0;
      }
      if (ABS(local_48 - local_38) <= fVar2 * 1e-06) {
        uStack_34 = q.w;
        fVar2 = fmaxf(ABS(uStack_44),ABS(uStack_34));
        if (fVar2 <= 1.0) {
          fVar2 = 1.0;
        }
        uVar1 = (uint)(ABS(uStack_44 - uStack_34) <= fVar2 * 1e-06);
      }
    }
  }
  return uVar1;
}

Assistant:

RMAPI int Vector4Equals(Vector4 p, Vector4 q)
{
#if !defined(EPSILON)
    #define EPSILON 0.000001f
#endif

    int result = ((fabsf(p.x - q.x)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.x), fabsf(q.x))))) &&
                  ((fabsf(p.y - q.y)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.y), fabsf(q.y))))) &&
                  ((fabsf(p.z - q.z)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.z), fabsf(q.z))))) &&
                  ((fabsf(p.w - q.w)) <= (EPSILON*fmaxf(1.0f, fmaxf(fabsf(p.w), fabsf(q.w)))));
    return result;
}